

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

void delete_node(qnode_ptr_t p,qnode_ptr_t *h,qnode_ptr_t *q)

{
  qnode_ptr_t ptVar1;
  t_qnode *ptVar2;
  qnode_ptr_t t;
  qnode_ptr_t s;
  qnode_ptr_t *q_local;
  qnode_ptr_t *h_local;
  qnode_ptr_t p_local;
  
  ptVar1 = p->back;
  ptVar2 = p->forth;
  if (ptVar2 == (t_qnode *)0x0) {
    *q = ptVar1;
  }
  else {
    ptVar2->back = ptVar1;
  }
  if (ptVar1 == (qnode_ptr_t)0x0) {
    *h = ptVar2;
  }
  else {
    ptVar1->forth = ptVar2;
  }
  free(p);
  return;
}

Assistant:

void delete_node(p,h,q)
qnode_ptr_t p, *h, *q ;

{ qnode_ptr_t s, t ;

  s = p->back ;
  t = p->forth ;
  if (t != (qnode_ptr_t)NULL) {
    t->back = s ;
  }
  else {
    *q = s ;
  }
  if (s != (qnode_ptr_t)NULL) {
    s->forth = t ;
  }
  else {
    *h = t ;
  }
  free(p) ;
}